

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void ImFontAtlasBuildFinish(ImFontAtlas *atlas)

{
  int iVar1;
  ImFontAtlasCustomRect *rect;
  ImFont **ppIVar2;
  ImFontGlyph *pIVar3;
  int local_48;
  ImWchar local_44 [2];
  int j;
  ImWchar ellipsis_variants [2];
  ImFont *font;
  int i_2;
  int i_1;
  ImVec2 uv1;
  ImVec2 uv0;
  ImFontAtlasCustomRect *r;
  int i;
  ImFontAtlas *atlas_local;
  
  if (atlas->TexPixelsAlpha8 == (uchar *)0x0) {
    __assert_fail("atlas->TexPixelsAlpha8 != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kentril0[P]OpenGL_Atmospheric_Scattering/src/libs/imgui/imgui_draw.cpp"
                  ,0x99f,"void ImFontAtlasBuildFinish(ImFontAtlas *)");
  }
  ImFontAtlasBuildRenderDefaultTexData(atlas);
  ImFontAtlasBuildRenderLinesTexData(atlas);
  for (r._4_4_ = 0; r._4_4_ < (atlas->CustomRects).Size; r._4_4_ = r._4_4_ + 1) {
    rect = ImVector<ImFontAtlasCustomRect>::operator[](&atlas->CustomRects,r._4_4_);
    if ((rect->Font != (ImFont *)0x0) && (rect->GlyphID != 0)) {
      if (rect->Font->ContainerAtlas != atlas) {
        __assert_fail("r->Font->ContainerAtlas == atlas",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kentril0[P]OpenGL_Atmospheric_Scattering/src/libs/imgui/imgui_draw.cpp"
                      ,0x9ab,"void ImFontAtlasBuildFinish(ImFontAtlas *)");
      }
      ImVec2::ImVec2(&uv1);
      ImVec2::ImVec2((ImVec2 *)&i_2);
      ImFontAtlas::CalcCustomRectUV(atlas,rect,&uv1,(ImVec2 *)&i_2);
      ImFont::AddGlyph(rect->Font,(ImFontConfig *)0x0,(ImWchar)rect->GlyphID,(rect->GlyphOffset).x,
                       (rect->GlyphOffset).y,(rect->GlyphOffset).x + (float)rect->Width,
                       (rect->GlyphOffset).y + (float)rect->Height,uv1.x,uv1.y,(float)i_2,(float)i_1
                       ,rect->GlyphAdvanceX);
    }
  }
  for (font._4_4_ = 0; font._4_4_ < (atlas->Fonts).Size; font._4_4_ = font._4_4_ + 1) {
    ppIVar2 = ImVector<ImFont_*>::operator[](&atlas->Fonts,font._4_4_);
    if (((*ppIVar2)->DirtyLookupTables & 1U) != 0) {
      ppIVar2 = ImVector<ImFont_*>::operator[](&atlas->Fonts,font._4_4_);
      ImFont::BuildLookupTable(*ppIVar2);
    }
  }
  font._0_4_ = 0;
  do {
    iVar1 = ImVector<ImFont_*>::size(&atlas->Fonts);
    if (iVar1 <= (int)font) {
      return;
    }
    ppIVar2 = ImVector<ImFont_*>::operator[](&atlas->Fonts,(int)font);
    _j = *ppIVar2;
    if ((*ppIVar2)->EllipsisChar == 0xffff) {
      local_44[0] = 0x2026;
      local_44[1] = 0x85;
      for (local_48 = 0; local_48 < 2; local_48 = local_48 + 1) {
        pIVar3 = ImFont::FindGlyphNoFallback(_j,local_44[local_48]);
        if (pIVar3 != (ImFontGlyph *)0x0) {
          _j->EllipsisChar = local_44[local_48];
          break;
        }
      }
    }
    font._0_4_ = (int)font + 1;
  } while( true );
}

Assistant:

void ImFontAtlasBuildFinish(ImFontAtlas* atlas)
{
    // Render into our custom data blocks
    IM_ASSERT(atlas->TexPixelsAlpha8 != NULL);
    ImFontAtlasBuildRenderDefaultTexData(atlas);
    ImFontAtlasBuildRenderLinesTexData(atlas);

    // Register custom rectangle glyphs
    for (int i = 0; i < atlas->CustomRects.Size; i++)
    {
        const ImFontAtlasCustomRect* r = &atlas->CustomRects[i];
        if (r->Font == NULL || r->GlyphID == 0)
            continue;

        // Will ignore ImFontConfig settings: GlyphMinAdvanceX, GlyphMinAdvanceY, GlyphExtraSpacing, PixelSnapH
        IM_ASSERT(r->Font->ContainerAtlas == atlas);
        ImVec2 uv0, uv1;
        atlas->CalcCustomRectUV(r, &uv0, &uv1);
        r->Font->AddGlyph(NULL, (ImWchar)r->GlyphID, r->GlyphOffset.x, r->GlyphOffset.y, r->GlyphOffset.x + r->Width, r->GlyphOffset.y + r->Height, uv0.x, uv0.y, uv1.x, uv1.y, r->GlyphAdvanceX);
    }

    // Build all fonts lookup tables
    for (int i = 0; i < atlas->Fonts.Size; i++)
        if (atlas->Fonts[i]->DirtyLookupTables)
            atlas->Fonts[i]->BuildLookupTable();

    // Ellipsis character is required for rendering elided text. We prefer using U+2026 (horizontal ellipsis).
    // However some old fonts may contain ellipsis at U+0085. Here we auto-detect most suitable ellipsis character.
    // FIXME: Also note that 0x2026 is currently seldom included in our font ranges. Because of this we are more likely to use three individual dots.
    for (int i = 0; i < atlas->Fonts.size(); i++)
    {
        ImFont* font = atlas->Fonts[i];
        if (font->EllipsisChar != (ImWchar)-1)
            continue;
        const ImWchar ellipsis_variants[] = { (ImWchar)0x2026, (ImWchar)0x0085 };
        for (int j = 0; j < IM_ARRAYSIZE(ellipsis_variants); j++)
            if (font->FindGlyphNoFallback(ellipsis_variants[j]) != NULL) // Verify glyph exists
            {
                font->EllipsisChar = ellipsis_variants[j];
                break;
            }
    }
}